

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_sbo_cow.hpp
# Opt level: O2

void __thiscall
printable_sbo_cow::printable_sbo_cow<large_printable>
          (printable_sbo_cow *this,large_printable *value)

{
  handle_base *phVar1;
  large_printable local_2028;
  
  (this->buffer_)._M_elems[8] = '\0';
  (this->buffer_)._M_elems[9] = '\0';
  (this->buffer_)._M_elems[10] = '\0';
  (this->buffer_)._M_elems[0xb] = '\0';
  (this->buffer_)._M_elems[0xc] = '\0';
  (this->buffer_)._M_elems[0xd] = '\0';
  (this->buffer_)._M_elems[0xe] = '\0';
  (this->buffer_)._M_elems[0xf] = '\0';
  (this->buffer_)._M_elems[0x10] = '\0';
  (this->buffer_)._M_elems[0x11] = '\0';
  (this->buffer_)._M_elems[0x12] = '\0';
  (this->buffer_)._M_elems[0x13] = '\0';
  (this->buffer_)._M_elems[0x14] = '\0';
  (this->buffer_)._M_elems[0x15] = '\0';
  (this->buffer_)._M_elems[0x16] = '\0';
  (this->buffer_)._M_elems[0x17] = '\0';
  this->handle_ = (handle_base *)0x0;
  (this->buffer_)._M_elems[0] = '\0';
  (this->buffer_)._M_elems[1] = '\0';
  (this->buffer_)._M_elems[2] = '\0';
  (this->buffer_)._M_elems[3] = '\0';
  (this->buffer_)._M_elems[4] = '\0';
  (this->buffer_)._M_elems[5] = '\0';
  (this->buffer_)._M_elems[6] = '\0';
  (this->buffer_)._M_elems[7] = '\0';
  local_2028.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_2028.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_2028.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (value->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  phVar1 = clone_impl<large_printable>(&local_2028,&this->buffer_);
  this->handle_ = phVar1;
  free(local_2028.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start);
  return;
}

Assistant:

printable_sbo_cow (T value) :
        handle_ (nullptr),
        buffer_ {}
    { handle_ = clone_impl(std::move(value), buffer_); }